

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_ShowGetFileName(char *pName,char *pBuffer)

{
  char cVar1;
  
  sprintf(pBuffer,"%s.dot",pName);
  for (; cVar1 = *pBuffer, cVar1 != '\0'; pBuffer = pBuffer + 1) {
    if ((0x19 < (byte)(cVar1 + 0x9fU) && 9 < (byte)(cVar1 - 0x30U)) &&
       (cVar1 != '.' && 0x19 < (byte)(cVar1 + 0xbfU))) {
      *pBuffer = '_';
    }
  }
  return;
}

Assistant:

void Abc_ShowGetFileName( char * pName, char * pBuffer )
{
    char * pCur;
    // creat the file name
    sprintf( pBuffer, "%s.dot", pName );
    // get rid of not-alpha-numeric characters
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !((*pCur >= '0' && *pCur <= '9') || (*pCur >= 'a' && *pCur <= 'z') || 
               (*pCur >= 'A' && *pCur <= 'Z') || (*pCur == '.')) )
            *pCur = '_';
}